

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Mapping.c
# Opt level: O1

char * AArch64_insn_name(csh handle,uint id)

{
  char **ppcVar1;
  long lVar2;
  
  if (0x1c3 < id) {
    return (char *)0x0;
  }
  if (id < 0x1a1) {
    ppcVar1 = &insn_name_maps[id].name;
  }
  else {
    lVar2 = 0;
    while (*(uint *)((long)&alias_insn_name_maps[0].id + lVar2) != id) {
      lVar2 = lVar2 + 0x10;
      if (lVar2 == 0x2b0) {
        return (char *)0x0;
      }
    }
    ppcVar1 = (char **)((long)&alias_insn_name_maps[0].name + lVar2);
  }
  return *ppcVar1;
}

Assistant:

const char *AArch64_insn_name(csh handle, unsigned int id)
{
#ifndef CAPSTONE_DIET
	unsigned int i;

	if (id >= ARM64_INS_ENDING)
		return NULL;

	if (id < ARR_SIZE(insn_name_maps))
		return insn_name_maps[id].name;

	// then find alias insn
	for (i = 0; i < ARR_SIZE(alias_insn_name_maps); i++) {
		if (alias_insn_name_maps[i].id == id)
			return alias_insn_name_maps[i].name;
	}

	// not found
	return NULL;
#else
	return NULL;
#endif
}